

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

void __thiscall Printer::printBoard(Printer *this,Board *board,Player *player1)

{
  bool bVar1;
  ostream *poVar2;
  Cell *pCVar3;
  Player *pPVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  undefined8 *puVar12;
  int j;
  uint uVar13;
  string LTTRS;
  Cell c;
  char local_a1;
  undefined8 *local_a0;
  int local_94;
  Printer *local_90;
  undefined1 *local_88;
  undefined8 *local_80;
  undefined1 local_78 [16];
  Cell local_68;
  ulong local_48;
  Player *local_40;
  Board *local_38;
  
  local_88 = local_78;
  local_90 = this;
  local_40 = player1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"ABCDEFGHJKLMNOPQRSTUVWXYZ","");
  iVar8 = board->size;
  local_a0 = (undefined8 *)(long)iVar8;
  iVar10 = iVar8 >> 0x1f;
  iVar8 = iVar8 / 10 + iVar10;
  local_94 = (iVar8 - iVar10) + 2;
  local_38 = board;
  if (-0x14 < (long)local_a0) {
    iVar7 = 1;
    if (1 < local_94) {
      iVar7 = local_94;
    }
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  if (0 < (int)(uint)local_a0) {
    puVar6 = (undefined8 *)0x0;
    puVar12 = &std::cout;
    do {
      if (local_80 <= puVar6) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",puVar6);
        goto LAB_00102020;
      }
      local_68.row_coordinate._0_1_ = local_88[(long)puVar6];
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_68,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      puVar6 = (undefined8 *)((long)puVar6 + 1);
    } while (local_a0 != puVar6);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  uVar13 = iVar8 - iVar10;
  if (-10 < (int)(uint)local_a0) {
    iVar8 = uVar13 + 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"+",1);
  if (0 < (int)(uint)local_a0) {
    uVar11 = (ulong)local_a0 & 0xffffffff;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--",2);
      uVar9 = (int)uVar11 - 1;
      uVar11 = (ulong)uVar9;
    } while (uVar9 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"+",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  if (0 < (int)(uint)local_a0) {
    uVar11 = 0;
    local_48 = (ulong)uVar13;
    do {
      iVar10 = (int)uVar11;
      iVar8 = (int)(uVar11 / 10);
      iVar7 = (int)local_48 - iVar8;
      if (iVar7 != 0 && iVar8 <= (int)local_48) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
      iVar8 = 0;
      do {
        pCVar3 = Board::getCell(local_38,iVar10,iVar8);
        local_68.playerOwned = pCVar3->playerOwned;
        local_68.row_coordinate = pCVar3->row_coordinate;
        local_68.column_coordinate = pCVar3->column_coordinate;
        local_68.occupied = pCVar3->occupied;
        local_68._9_7_ = *(undefined7 *)&pCVar3->field_0x9;
        bVar1 = Cell::isOccupied(&local_68);
        if (bVar1) {
          pPVar4 = Cell::getPlayerOwned(&local_68);
          if (pPVar4 == local_40) {
            local_a1 = local_90->player1Icon;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_a1,1);
          }
          else {
            local_a1 = local_90->player2Icon;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_a1,1);
          }
        }
        else {
          local_a1 = local_90->emptyCellIcon;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_a1,1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        iVar8 = iVar8 + 1;
      } while ((uint)local_a0 != iVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
      std::ostream::operator<<((ostream *)&std::cout,iVar10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      uVar11 = (ulong)(iVar10 + 1U);
      uVar13 = (uint)local_48;
    } while (iVar10 + 1U != (uint)local_a0);
  }
  if (-10 < (int)(uint)local_a0) {
    iVar8 = uVar13 + 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"+",1);
  if (0 < (int)(uint)local_a0) {
    uVar11 = (ulong)local_a0 & 0xffffffff;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--",2);
      uVar13 = (int)uVar11 - 1;
      uVar11 = (ulong)uVar13;
    } while (uVar13 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"+",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  if (-0x14 < (int)(uint)local_a0) {
    iVar8 = 1;
    if (1 < local_94) {
      iVar8 = local_94;
    }
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  if (0 < (int)(uint)local_a0) {
    puVar12 = (undefined8 *)0x0;
    do {
      if (local_80 <= puVar12) {
LAB_00102020:
        uVar5 = std::__throw_out_of_range_fmt
                          ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                           puVar12);
        if (local_88 != local_78) {
          operator_delete(local_88);
        }
        _Unwind_Resume(uVar5);
      }
      local_68.row_coordinate._0_1_ = local_88[(long)puVar12];
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_68,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      puVar12 = (undefined8 *)((long)puVar12 + 1);
    } while (local_a0 != puVar12);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  return;
}

Assistant:

void Printer::printBoard(Board& board, const Player* player1){

  const string LTTRS = "ABCDEFGHJKLMNOPQRSTUVWXYZ";
  int n = board.size;

  // printing header
  for (int i=0; i<n/10+2; i++) cout << " "; // print offset created by row numbering
  for (int i=0; i<n; i++) cout << LTTRS.at(i) << " ";
  cout.put(cout.widen('\n'));
  cout.flush();
  for (int i=0; i<n/10+1; i++) cout << " ";
  cout << "+";
  for (int i=0; i<n; i++) cout <<"--";
  cout << "+";
  cout.put(cout.widen('\n'));
  cout.flush();

  // printing each row
  for (int i=0; i<n; i++){

    // printing row numbering at left side
    for (int j=0; j<n/10-i/10; j++) cout << " "; // print trailing spaces for formatting
    cout << i << "|";

    for (int j=0; j<n; j++){

        Cell c = board.getCell(i,j);
        if (!c.isOccupied()) cout << this->emptyCellIcon;
        else if (c.getPlayerOwned() == player1) cout << this ->player1Icon;
        else cout << this->player2Icon;

        cout << " ";
    }
    // printing row numbering at the right side
    cout << "|" << i;
    cout.put(cout.widen('\n'));
    cout.flush();
  }

  // printing footer
  for (int i=0; i<n/10+1; i++) cout << " ";
  cout << "+";
  for (int i=0; i<n; i++) cout <<"--";
  cout << "+";
  cout.put(cout.widen('\n'));
  cout.flush();
  for (int i=0; i<n/10+2; i++) cout << " ";
  for (int i=0; i<n; i++) cout << LTTRS.at(i) << " ";
  cout.put(cout.widen('\n'));
  cout.flush();

}